

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O3

void __thiscall
pbrt::TextureSceneEntity::TextureSceneEntity
          (TextureSceneEntity *this,string *texName,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromObject)

{
  pointer pcVar1;
  string local_b8;
  ParameterDictionary local_98;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_98.params,&parameters->params);
  local_98.colorSpace = parameters->colorSpace;
  TransformedSceneEntity::TransformedSceneEntity
            (&this->super_TransformedSceneEntity,&local_b8,&local_98,loc,renderFromObject);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_98.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (this->texName)._M_dataplus._M_p = (pointer)&(this->texName).field_2;
  pcVar1 = (texName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->texName,pcVar1,pcVar1 + texName->_M_string_length);
  return;
}

Assistant:

TextureSceneEntity(const std::string &texName, ParameterDictionary parameters,
                       FileLoc loc, const AnimatedTransform &renderFromObject)
        : TransformedSceneEntity("", std::move(parameters), loc, renderFromObject),
          texName(texName) {}